

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O2

void __thiscall
cm::uv_handle_deleter<uv_pipe_s>::operator()
          (uv_handle_deleter<uv_pipe_s> *this,uv_pipe_s *type_handle)

{
  int iVar1;
  
  if (type_handle != (uv_pipe_s *)0x0) {
    iVar1 = uv_is_closing((uv_handle_t *)type_handle);
    if (iVar1 != 0) {
      __assert_fail("!uv_is_closing(handle)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmUVHandlePtr.cxx"
                    ,0x18,"void cm::default_delete(T *) [T = uv_pipe_s]");
    }
    iVar1 = uv_is_closing((uv_handle_t *)type_handle);
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)type_handle,close_delete);
      return;
    }
  }
  return;
}

Assistant:

static void default_delete(T* type_handle)
{
  auto handle = reinterpret_cast<uv_handle_t*>(type_handle);
  if (handle) {
    assert(!uv_is_closing(handle));
    if (!uv_is_closing(handle)) {
      uv_close(handle, &close_delete);
    }
  }
}